

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O3

void __thiscall pbrt::syntactic::Material::Material(Material *this,string *type)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  p_Var1 = &(this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->attributes).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->attributes).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar2 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar2,pcVar2 + type->_M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Material(const std::string &type) : type(type) {}